

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O3

int AF_A_ClassBossHealth(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  PClass *pPVar4;
  undefined4 in_register_00000014;
  ulong uVar5;
  undefined8 *puVar6;
  VMValue *pVVar7;
  char *__assertion;
  bool bVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  uVar5 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00526cae;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    puVar6 = (undefined8 *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (puVar6 == (undefined8 *)0x0) {
LAB_00526ba7:
        puVar6 = (undefined8 *)0x0;
        pVVar7 = param;
      }
      else {
        auVar10._8_8_ = uVar5;
        auVar10._0_8_ = puVar6[1];
        if (puVar6[1] == 0) {
          auVar10 = (**(code **)*puVar6)(puVar6);
          puVar6[1] = auVar10._0_8_;
        }
        pPVar4 = auVar10._0_8_;
        bVar8 = pPVar4 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar8;
        uVar5 = (ulong)bVar8;
        bVar9 = pPVar4 == pPVar3;
        if (!bVar9 && !bVar8) {
          do {
            pPVar4 = pPVar4->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar4 != (PClass *)0x0);
            if (pPVar4 == pPVar3) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        pVVar7 = (VMValue *)(ulong)(bVar9 || bVar8);
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00526cae;
        }
      }
      pPVar3 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_00526c58;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_00526c9e;
        puVar2 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar2 != (undefined8 *)0x0) {
            pPVar4 = (PClass *)puVar2[1];
            if (pPVar4 == (PClass *)0x0) {
              pPVar4 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar7,uVar5,ret);
              puVar2[1] = pPVar4;
            }
            bVar8 = pPVar4 != (PClass *)0x0;
            if (pPVar4 != pPVar3 && bVar8) {
              do {
                pPVar4 = pPVar4->ParentClass;
                bVar8 = pPVar4 != (PClass *)0x0;
                if (pPVar4 == pPVar3) break;
              } while (pPVar4 != (PClass *)0x0);
            }
            if (!bVar8) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_00526cae;
            }
          }
        }
        else if (puVar2 != (undefined8 *)0x0) goto LAB_00526c9e;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_00526c58:
        if (((multiplayer == true) && (deathmatch.Value == 0)) &&
           (*(int *)((long)puVar6 + 0x1ac) == 0)) {
          *(int *)((long)puVar6 + 0x1cc) = *(int *)((long)puVar6 + 0x1cc) * 5;
          *(undefined4 *)((long)puVar6 + 0x1ac) = 1;
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_00526cae;
    }
    if (puVar6 == (undefined8 *)0x0) goto LAB_00526ba7;
  }
LAB_00526c9e:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_00526cae:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                ,0xdd7,"int AF_A_ClassBossHealth(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ClassBossHealth)
{
	PARAM_ACTION_PROLOGUE;
	if (multiplayer && !deathmatch)		// co-op only
	{
		if (!self->special1)
		{
			self->health *= 5;
			self->special1 = true;   // has been initialized
		}
	}
	return 0;
}